

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::begin_record
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  char cVar1;
  reference pvVar2;
  undefined8 in_RDX;
  basic_json_visitor<char> *in_RSI;
  vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  semantic_tag tag;
  
  tag = (semantic_tag)((ulong)in_RDX >> 0x38);
  in_RDI[5].super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                     (in_RDI);
  if ((*pvVar2 == header) &&
     ((pointer)((long)in_RDI[3].
                      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)in_RDI[9].
                     super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                     ._M_impl.super__Vector_impl_data._M_finish) <
      in_RDI[2].
      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pvVar2 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                       (in_RDI);
    *pvVar2 = data;
  }
  pvVar2 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                     (in_RDI);
  if (*pvVar2 == header) {
    if (((*(char *)((long)&in_RDI[3].
                           super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 4) == '\x01') &&
        (((ulong)in_RDI[2].
                 super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x100000000) != 0)) &&
       (in_RDI[2].
        super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (pointer)((long)in_RDI[8].
                        super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage +
                 (long)in_RDI[9].
                       super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                       ._M_impl.super__Vector_impl_data._M_finish))) {
      basic_json_visitor<char>::begin_array
                (in_RSI,tag,(ser_context *)in_RDI,
                 (error_code *)CONCAT44(1,in_stack_ffffffffffffffd8));
      *(byte *)&in_RDI[8].
                super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                ._M_impl.super__Vector_impl_data._M_finish =
           (*(byte *)&in_RDI[9].
                      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                      ._M_impl.super__Vector_impl_data._M_start ^ 0xff) & 1;
      *(int *)&in_RDI[5].
               super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&in_RDI[5].
                    super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  else if (*pvVar2 == data) {
    cVar1 = *(char *)((long)&in_RDI[3].
                             super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4);
    uVar3 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffd8);
    if (cVar1 == '\x01') {
      basic_json_visitor<char>::begin_array
                (in_RSI,tag,(ser_context *)in_RDI,(error_code *)CONCAT44(2,uVar3));
      *(byte *)&in_RDI[8].
                super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                ._M_impl.super__Vector_impl_data._M_finish =
           (*(byte *)&in_RDI[9].
                      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                      ._M_impl.super__Vector_impl_data._M_start ^ 0xff) & 1;
      *(int *)&in_RDI[5].
               super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&in_RDI[5].
                    super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    else if (cVar1 == '\x02') {
      basic_json_visitor<char>::begin_object
                (in_RSI,tag,(ser_context *)in_RDI,(error_code *)CONCAT44(2,uVar3));
      *(byte *)&in_RDI[8].
                super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                ._M_impl.super__Vector_impl_data._M_finish =
           (*(byte *)&in_RDI[9].
                      super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                      ._M_impl.super__Vector_impl_data._M_start ^ 0xff) & 1;
      *(int *)&in_RDI[5].
               super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&in_RDI[5].
                    super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  return;
}

Assistant:

void begin_record(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        offset_ = 0;

        if (stack_.back() == csv_mode::header && line_ > (header_lines_+header_line_offset_))
        {
            stack_.back() = csv_mode::data;
        }
        switch (stack_.back())
        {
            case csv_mode::header:
                switch (mapping_kind_)
                {
                    case csv_mapping_kind::n_rows:
                        if (assume_header_ && line_ == (header_line_+header_line_offset_))
                        {
                            visitor.begin_array(semantic_tag::none, *this, ec);
                            more_ = !cursor_mode_;
                            ++level_;
                        }
                        break;
                    default:
                        break;
                }
                break;
            case csv_mode::data:
                switch (mapping_kind_)
                {
                    case csv_mapping_kind::n_rows:
                        visitor.begin_array(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                        break;
                    case csv_mapping_kind::n_objects:
                        visitor.begin_object(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        ++level_;
                        break;
                    case csv_mapping_kind::m_columns:
                        break;
                    default:
                        break;
                }
                break;
            default:
                break;
        }
    }